

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O3

void Ga2_GlaPrepareCexAndMap(Ga2_Man_t *p,Abc_Cex_t **ppCex,Vec_Int_t **pvMaps)

{
  Gia_Obj_t *pGVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  Vec_Int_t *p_00;
  int *piVar5;
  Vec_Int_t *pVVar6;
  Abc_Cex_t *pAVar7;
  int iVar8;
  Abs_Par_t *pAVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  long local_48;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar5 = (int *)malloc(4000);
  p_00->pArray = piVar5;
  pVVar6 = p->vValues;
  if (pVVar6->nSize < 1) {
    uVar3 = 0;
  }
  else {
    lVar10 = 0;
    do {
      iVar13 = pVVar6->pArray[lVar10];
      lVar12 = (long)iVar13;
      if ((lVar12 < 0) || (p->pGia->nObjs <= iVar13)) {
LAB_00608635:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar1 = p->pGia->pObjs;
      if (pGVar1 == (Gia_Obj_t *)0x0) break;
      if (lVar10 != 0) {
        if (p->vIds->nSize <= iVar13) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        pGVar1 = pGVar1 + lVar12;
        uVar3 = p->vIds->pArray[lVar12];
        if ((int)uVar3 < 0) {
          if (*(long *)pGVar1 < 0) {
            __assert_fail("Ga2_ObjIsLeaf(p, pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absGla.c"
                          ,0x4f2,
                          "void Ga2_GlaPrepareCexAndMap(Ga2_Man_t *, Abc_Cex_t **, Vec_Int_t **)");
          }
LAB_006086b7:
          __assert_fail("pObj->fPhase",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absGla.c"
                        ,0x4f1,
                        "void Ga2_GlaPrepareCexAndMap(Ga2_Man_t *, Abc_Cex_t **, Vec_Int_t **)");
        }
        if (p->vCnfs->nSize <= (int)(uVar3 * 2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        if (p->vCnfs->pArray[(ulong)uVar3 * 2] == (void *)0x0) {
          lVar12 = *(long *)pGVar1;
          if (-1 < lVar12) goto LAB_006086b7;
          uVar3 = (uint)lVar12;
          uVar4 = ~uVar3;
          if (((uVar4 & 0x9fffffff) != 0) && ((int)uVar3 < 0 || (uVar4 & 0x1fffffff) == 0)) {
            __assert_fail("Gia_ObjIsAnd(pObj) || Gia_ObjIsCi(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absGla.c"
                          ,0x4f3,
                          "void Ga2_GlaPrepareCexAndMap(Ga2_Man_t *, Abc_Cex_t **, Vec_Int_t **)");
          }
          Vec_IntPush(p_00,iVar13);
          pVVar6 = p->vValues;
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar6->nSize);
    uVar3 = p_00->nSize;
  }
  pAVar7 = Abc_CexAlloc(0,uVar3,p->pPars->iFrame + 1);
  pAVar9 = p->pPars;
  iVar13 = pAVar9->iFrame;
  pAVar7->iFrame = iVar13;
  if (-1 < iVar13) {
    local_48 = 0;
    iVar13 = 0;
    do {
      if (0 < (int)uVar3) {
        piVar5 = p_00->pArray;
        uVar11 = 0;
        do {
          iVar8 = piVar5[uVar11];
          if (((long)iVar8 < 0) || (p->pGia->nObjs <= iVar8)) goto LAB_00608635;
          pGVar1 = p->pGia->pObjs;
          if (pGVar1 == (Gia_Obj_t *)0x0) break;
          pGVar1 = pGVar1 + iVar8;
          uVar4 = Ga2_ObjFindLit(p,pGVar1,iVar13);
          if ((~*(ulong *)pGVar1 & 0x1fffffff1fffffff) == 0) {
            __assert_fail("!Gia_ObjIsConst0(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absGla.c"
                          ,0x487,"int Ga2_ObjSatValue(Ga2_Man_t *, Gia_Obj_t *, int)");
          }
          if (uVar4 != 0xffffffff) {
            if ((int)uVar4 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            if (((int)(uVar4 >> 1) < p->pSat->size) &&
               (((p->pSat->model[uVar4 >> 1] != 1 ^ (byte)uVar4) & 1) == 0)) {
              iVar8 = (int)local_48 + (int)uVar11;
              (&pAVar7[1].iPo)[iVar8 >> 5] =
                   (&pAVar7[1].iPo)[iVar8 >> 5] | 1 << ((byte)iVar8 & 0x1f);
            }
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < uVar3);
        pAVar9 = p->pPars;
      }
      local_48 = local_48 + (ulong)uVar3;
      bVar2 = iVar13 < pAVar9->iFrame;
      iVar13 = iVar13 + 1;
    } while (bVar2);
  }
  *pvMaps = p_00;
  *ppCex = pAVar7;
  return;
}

Assistant:

void Ga2_GlaPrepareCexAndMap( Ga2_Man_t * p, Abc_Cex_t ** ppCex, Vec_Int_t ** pvMaps )
{
    Abc_Cex_t * pCex;
    Vec_Int_t * vMap;
    Gia_Obj_t * pObj;
    int f, i, k;
/*
    Gia_ManForEachObj( p->pGia, pObj, i )
        if ( Ga2_ObjId(p, pObj) >= 0 )
            assert( Vec_IntEntry(p->vValues, Ga2_ObjId(p, pObj)) == i );
*/
    // find PIs and PPIs
    vMap = Vec_IntAlloc( 1000 );
    Gia_ManForEachObjVec( p->vValues, p->pGia, pObj, i )
    {
        if ( !i ) continue;
        if ( Ga2_ObjIsAbs(p, pObj) )
            continue;
        assert( pObj->fPhase );
        assert( Ga2_ObjIsLeaf(p, pObj) );
        assert( Gia_ObjIsAnd(pObj) || Gia_ObjIsCi(pObj) );
        Vec_IntPush( vMap, Gia_ObjId(p->pGia, pObj) );
    }
    // derive counter-example
    pCex = Abc_CexAlloc( 0, Vec_IntSize(vMap), p->pPars->iFrame+1 );
    pCex->iFrame = p->pPars->iFrame;
    for ( f = 0; f <= p->pPars->iFrame; f++ )
        Gia_ManForEachObjVec( vMap, p->pGia, pObj, k )
            if ( Ga2_ObjSatValue( p, pObj, f ) )
                Abc_InfoSetBit( pCex->pData, f * Vec_IntSize(vMap) + k );
    *pvMaps = vMap;
    *ppCex = pCex;
}